

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O1

void ndn_forwarder_init(void)

{
  ndn_msgqueue_init();
  ndn_nametree_init(forwarder.memory,0x40);
  forwarder.nametree = forwarder.memory;
  ndn_facetab_init(forwarder.memory + 0xb80,10);
  forwarder.facetab = (ndn_face_table_t *)(forwarder.memory + 0xb80);
  ndn_fib_init(forwarder.memory + 0xbd8,0x14,forwarder.nametree);
  forwarder.fib = (ndn_fib_t *)(forwarder.memory + 0xbd8);
  ndn_pit_init(forwarder.memory + 0xe68,0x20,forwarder.nametree);
  forwarder.pit = (ndn_pit_t *)(forwarder.memory + 0xe68);
  return;
}

Assistant:

void
ndn_forwarder_init(void)
{
  uint8_t* ptr = (uint8_t*)forwarder.memory;
  ndn_msgqueue_init();

  ndn_nametree_init(ptr, NDN_NAMETREE_MAX_SIZE);
  forwarder.nametree = (ndn_nametree_t*)ptr;
  ptr += NDN_NAMETREE_RESERVE_SIZE(NDN_NAMETREE_MAX_SIZE);

  ndn_facetab_init(ptr, NDN_FACE_TABLE_MAX_SIZE);
  forwarder.facetab = (ndn_face_table_t*)ptr;
  ptr += NDN_FACE_TABLE_RESERVE_SIZE(NDN_FACE_TABLE_MAX_SIZE);

  ndn_fib_init(ptr, NDN_FIB_MAX_SIZE, forwarder.nametree);
  forwarder.fib = (ndn_fib_t*)ptr;
  ptr += NDN_FIB_RESERVE_SIZE(NDN_FIB_MAX_SIZE);

  ndn_pit_init(ptr, NDN_PIT_MAX_SIZE, forwarder.nametree);
  forwarder.pit = (ndn_pit_t*)ptr;
  ptr += NDN_PIT_RESERVE_SIZE(NDN_PIT_MAX_SIZE);
}